

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  long *__s;
  MemoryMappedFile file;
  allocator local_81;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  MemoryMappedFile local_60;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if ((exr_version == (EXRVersion *)0x0 || exr_header == (EXRHeader *)0x0) ||
      filename == (char *)0x0) {
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Invalid argument for ParseEXRHeaderFromFile","");
    plVar3 = local_80;
    if (err != (char **)0x0) {
      pcVar2 = strdup((char *)local_80);
      *err = pcVar2;
    }
    if (plVar3 != &local_70) {
      operator_delete(plVar3);
    }
    iVar1 = -3;
  }
  else {
    MemoryMappedFile::MemoryMappedFile(&local_60,filename);
    if (local_60.data == (uchar *)0x0) {
      std::__cxx11::string::string((string *)local_48,filename,&local_81);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x123303);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_70 = *plVar4;
        lStack_68 = plVar3[3];
        __s = &local_70;
      }
      else {
        local_70 = *plVar4;
        __s = (long *)*plVar3;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_80 = __s;
      if (err != (char **)0x0) {
        pcVar2 = strdup((char *)__s);
        *err = pcVar2;
      }
      if (__s != &local_70) {
        operator_delete(__s);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      iVar1 = -7;
    }
    else {
      iVar1 = ParseEXRHeaderFromMemory(exr_header,exr_version,local_60.data,local_60.size,err);
    }
    MemoryMappedFile::~MemoryMappedFile(&local_60);
  }
  return iVar1;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for ParseEXRHeaderFromFile",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, file.data, file.size,
                                  err);
}